

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

void ssw_strip(char **str)

{
  size_t sVar1;
  long *in_RDI;
  size_t i;
  size_t l;
  ulong local_18;
  
  sVar1 = strlen((char *)*in_RDI);
  for (local_18 = 0; *(char *)(*in_RDI + local_18) == ' '; local_18 = local_18 + 1) {
  }
  if (local_18 != 0) {
    memmove((void *)*in_RDI,(void *)(*in_RDI + local_18),(sVar1 + 1) - local_18);
  }
  if (local_18 < sVar1) {
    local_18 = sVar1 - local_18;
    do {
      local_18 = local_18 + -1;
      if (*(char *)(*in_RDI + local_18) != ' ') {
        return;
      }
      *(undefined1 *)(*in_RDI + local_18) = 0;
    } while (local_18 != 0);
  }
  return;
}

Assistant:

void ssw_strip(char **str) {
  size_t l = strlen(*str);
  size_t i = 0;
  while ((*str)[i]==' ')
    ++i;
  if (i)
    memmove(*str,*str+i,l+1-i);
  if ( l <= i )
    return;
  i = (size_t)((l-i)-1);
  while ( (*str)[i]==' ' ) {
    (*str)[i]='\0';
    if (!i)
      break;
    --i;
  }
}